

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_extract_to_file
                  (mz_zip_archive *pZip,mz_uint file_index,char *pDst_filename,mz_uint flags)

{
  mz_bool mVar1;
  int iVar2;
  FILE *__stream;
  char *in_RDX;
  long in_RDI;
  FILE *pFile;
  mz_zip_archive_file_stat file_stat;
  mz_bool status;
  mz_uint in_stack_00002b44;
  void *in_stack_00002b48;
  mz_file_write_func in_stack_00002b50;
  mz_uint in_stack_00002b5c;
  mz_zip_archive *in_stack_00002b60;
  mz_zip_archive_file_stat *in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  mz_uint in_stack_fffffffffffffb64;
  mz_zip_archive *in_stack_fffffffffffffb68;
  int local_45c;
  int local_454;
  int local_50;
  mz_bool local_30;
  
  mVar1 = mz_zip_reader_file_stat
                    (in_stack_fffffffffffffb68,in_stack_fffffffffffffb64,in_stack_fffffffffffffb58);
  if (mVar1 == 0) {
    local_30 = 0;
  }
  else if ((local_45c == 0) && (local_454 != 0)) {
    __stream = fopen64(in_RDX,"wb");
    if (__stream == (FILE *)0x0) {
      if (in_RDI != 0) {
        *(undefined4 *)(in_RDI + 0x1c) = 0x11;
      }
      local_30 = 0;
    }
    else {
      local_50 = mz_zip_reader_extract_to_callback
                           (in_stack_00002b60,in_stack_00002b5c,in_stack_00002b50,in_stack_00002b48,
                            in_stack_00002b44);
      iVar2 = fclose(__stream);
      if (iVar2 == -1) {
        if ((local_50 != 0) && (in_RDI != 0)) {
          *(undefined4 *)(in_RDI + 0x1c) = 0x15;
        }
        local_50 = 0;
      }
      if (local_50 != 0) {
        mz_zip_set_file_times
                  ((char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   (time_t)in_stack_fffffffffffffb58,(time_t)__stream);
      }
      local_30 = local_50;
    }
  }
  else {
    if (in_RDI != 0) {
      *(undefined4 *)(in_RDI + 0x1c) = 6;
    }
    local_30 = 0;
  }
  return local_30;
}

Assistant:

mz_bool mz_zip_reader_extract_to_file(mz_zip_archive *pZip, mz_uint file_index,
                                      const char *pDst_filename,
                                      mz_uint flags) {
  mz_bool status;
  mz_zip_archive_file_stat file_stat;
  MZ_FILE *pFile;

  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;

  if (file_stat.m_is_directory || (!file_stat.m_is_supported))
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_FEATURE);

  pFile = MZ_FOPEN(pDst_filename, "wb");
  if (!pFile)
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_OPEN_FAILED);

  status = mz_zip_reader_extract_to_callback(
      pZip, file_index, mz_zip_file_write_callback, pFile, flags);

  if (MZ_FCLOSE(pFile) == EOF) {
    if (status)
      mz_zip_set_error(pZip, MZ_ZIP_FILE_CLOSE_FAILED);

    status = MZ_FALSE;
  }

#if !defined(MINIZ_NO_TIME) && !defined(MINIZ_NO_STDIO)
  if (status)
    mz_zip_set_file_times(pDst_filename, file_stat.m_time, file_stat.m_time);
#endif

  return status;
}